

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling_3x3_pack8.h
# Opt level: O1

void ncnn::pooling3x3s2_max_pack8_avx(Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined1 (*pauVar1) [32];
  undefined1 auVar2 [32];
  int iVar3;
  uint uVar4;
  int iVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  int iVar12;
  uint uVar13;
  long lVar14;
  int iVar15;
  uint uVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  undefined1 (*pauVar21) [32];
  undefined1 (*pauVar22) [32];
  undefined1 (*pauVar23) [32];
  undefined1 (*pauVar24) [32];
  
  iVar3 = bottom_blob->c;
  if (0 < (long)iVar3) {
    uVar4 = top_blob->w;
    iVar5 = top_blob->h;
    lVar19 = (long)(int)((bottom_blob->w - uVar4) * 0x10);
    lVar18 = 0;
    do {
      if (0 < iVar5) {
        pauVar23 = (undefined1 (*) [32])
                   (top_blob->cstep * lVar18 * top_blob->elemsize + (long)top_blob->data);
        pauVar24 = (undefined1 (*) [32])
                   (bottom_blob->cstep * lVar18 * bottom_blob->elemsize + (long)bottom_blob->data);
        lVar20 = (long)bottom_blob->w * bottom_blob->elemsize;
        pauVar22 = (undefined1 (*) [32])(*pauVar24 + lVar20 * 2);
        pauVar21 = (undefined1 (*) [32])(*pauVar24 + lVar20);
        iVar15 = 0;
        do {
          if ((int)uVar4 < 4) {
            uVar13 = 0;
          }
          else {
            iVar12 = 3;
            do {
              auVar6 = vmaxps_avx(*pauVar24,pauVar24[1]);
              auVar6 = vmaxps_avx(auVar6,pauVar24[2]);
              auVar6 = vmaxps_avx(auVar6,*pauVar21);
              auVar7 = vmaxps_avx(auVar6,pauVar21[1]);
              auVar6 = pauVar24[4];
              auVar8 = vmaxps_avx(pauVar21[2],*pauVar22);
              auVar2 = pauVar21[4];
              auVar9 = vmaxps_avx(auVar8,pauVar22[1]);
              auVar8 = pauVar22[2];
              auVar9 = vmaxps_avx(auVar9,auVar8);
              auVar9 = vmaxps_avx(auVar7,auVar9);
              auVar10 = vmaxps_avx(auVar6,pauVar24[3]);
              auVar7 = pauVar22[4];
              auVar10 = vmaxps_avx(auVar10,pauVar24[2]);
              auVar10 = vmaxps_avx(auVar10,pauVar21[3]);
              auVar11 = vmaxps_avx(pauVar21[2],pauVar22[3]);
              *pauVar23 = auVar9;
              auVar9 = vmaxps_avx(auVar2,auVar7);
              auVar8 = vmaxps_avx(auVar9,auVar8);
              auVar8 = vmaxps_avx(auVar8,auVar11);
              auVar10 = vmaxps_avx(auVar10,auVar8);
              auVar8 = pauVar24[6];
              auVar9 = pauVar21[6];
              auVar11 = vmaxps_avx(auVar8,pauVar24[5]);
              auVar6 = vmaxps_avx(auVar11,auVar6);
              auVar11 = vmaxps_avx(auVar6,pauVar21[5]);
              auVar2 = vmaxps_avx(auVar2,pauVar22[5]);
              auVar6 = pauVar22[6];
              pauVar23[1] = auVar10;
              auVar10 = vmaxps_avx(auVar9,auVar6);
              auVar7 = vmaxps_avx(auVar10,auVar7);
              auVar2 = vmaxps_avx(auVar7,auVar2);
              auVar7 = vmaxps_avx(pauVar24[7],pauVar24[8]);
              auVar2 = vmaxps_avx(auVar11,auVar2);
              auVar8 = vmaxps_avx(auVar7,auVar8);
              auVar8 = vmaxps_avx(auVar8,pauVar21[7]);
              auVar8 = vmaxps_avx(auVar8,pauVar21[8]);
              auVar7 = vmaxps_avx(auVar9,pauVar22[7]);
              pauVar21 = pauVar21 + 8;
              auVar8 = vmaxps_avx(auVar8,pauVar22[8]);
              pauVar22 = pauVar22 + 8;
              pauVar24 = pauVar24 + 8;
              pauVar23[2] = auVar2;
              auVar6 = vmaxps_avx(auVar6,auVar7);
              auVar6 = vmaxps_avx(auVar8,auVar6);
              pauVar23[3] = auVar6;
              pauVar23 = pauVar23 + 4;
              iVar12 = iVar12 + 4;
              uVar13 = uVar4 & 0xfffffffc;
            } while (iVar12 < (int)uVar4);
          }
          uVar16 = uVar13 | 1;
          while ((int)uVar16 < (int)uVar4) {
            pauVar1 = pauVar21 + 2;
            auVar6 = pauVar22[2];
            auVar2 = vmaxps_avx(*pauVar24,pauVar24[1]);
            auVar2 = vmaxps_avx(auVar2,pauVar24[2]);
            auVar2 = vmaxps_avx(auVar2,*pauVar21);
            auVar2 = vmaxps_avx(auVar2,pauVar21[1]);
            auVar8 = vmaxps_avx(*pauVar1,*pauVar22);
            auVar8 = vmaxps_avx(auVar8,pauVar22[1]);
            auVar8 = vmaxps_avx(auVar8,auVar6);
            auVar7 = vmaxps_avx(pauVar24[3],pauVar24[4]);
            auVar7 = vmaxps_avx(auVar7,pauVar24[2]);
            auVar7 = vmaxps_avx(auVar7,pauVar21[3]);
            auVar7 = vmaxps_avx(auVar7,pauVar21[4]);
            auVar2 = vmaxps_avx(auVar2,auVar8);
            pauVar21 = pauVar21 + 4;
            auVar8 = vmaxps_avx(*pauVar1,pauVar22[3]);
            auVar7 = vmaxps_avx(auVar7,pauVar22[4]);
            pauVar22 = pauVar22 + 4;
            pauVar24 = pauVar24 + 4;
            *pauVar23 = auVar2;
            auVar6 = vmaxps_avx(auVar6,auVar8);
            auVar6 = vmaxps_avx(auVar7,auVar6);
            pauVar23[1] = auVar6;
            pauVar23 = pauVar23 + 2;
            uVar16 = uVar13 + 3;
            uVar13 = uVar13 + 2;
          }
          iVar12 = uVar4 - uVar13;
          if (iVar12 != 0 && (int)uVar13 <= (int)uVar4) {
            lVar14 = 0;
            lVar20 = 0;
            do {
              lVar17 = lVar20;
              auVar6 = vmaxps_avx(*(undefined1 (*) [32])(*pauVar24 + lVar17 * 2),
                                  *(undefined1 (*) [32])(pauVar24[1] + lVar17 * 2));
              auVar6 = vmaxps_avx(auVar6,*(undefined1 (*) [32])(pauVar24[2] + lVar17 * 2));
              auVar6 = vmaxps_avx(auVar6,*(undefined1 (*) [32])(*pauVar21 + lVar17 * 2));
              auVar6 = vmaxps_avx(auVar6,*(undefined1 (*) [32])(pauVar21[1] + lVar17 * 2));
              auVar2 = vmaxps_avx(*(undefined1 (*) [32])(pauVar21[2] + lVar17 * 2),
                                  *(undefined1 (*) [32])(*pauVar22 + lVar17 * 2));
              auVar2 = vmaxps_avx(auVar2,*(undefined1 (*) [32])(pauVar22[1] + lVar17 * 2));
              auVar2 = vmaxps_avx(auVar2,*(undefined1 (*) [32])(pauVar22[2] + lVar17 * 2));
              auVar6 = vmaxps_avx(auVar6,auVar2);
              *(undefined1 (*) [32])(*pauVar23 + lVar17) = auVar6;
              lVar14 = lVar14 + -0x40;
              iVar12 = iVar12 + -1;
              lVar20 = lVar17 + 0x20;
            } while (iVar12 != 0);
            pauVar23 = (undefined1 (*) [32])(pauVar23[1] + lVar17);
            pauVar24 = (undefined1 (*) [32])((long)pauVar24 - lVar14);
            pauVar21 = (undefined1 (*) [32])((long)pauVar21 - lVar14);
            pauVar22 = (undefined1 (*) [32])((long)pauVar22 - lVar14);
          }
          pauVar24 = (undefined1 (*) [32])(*pauVar24 + lVar19 * 4);
          pauVar21 = (undefined1 (*) [32])(*pauVar21 + lVar19 * 4);
          pauVar22 = (undefined1 (*) [32])(*pauVar22 + lVar19 * 4);
          iVar15 = iVar15 + 1;
        } while (iVar15 != iVar5);
      }
      lVar18 = lVar18 + 1;
    } while (lVar18 != iVar3);
  }
  return;
}

Assistant:

static void pooling3x3s2_max_pack8_avx(const Mat& bottom_blob, Mat& top_blob, const Option& opt)
{
    int w = bottom_blob.w;
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;

    const int tailstep = (w - 2 * outw + w) * 8;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < inch; q++)
    {
        const Mat img0 = bottom_blob.channel(q);
        float* outptr = top_blob.channel(q);

        const float* r0 = img0.row(0);
        const float* r1 = img0.row(1);
        const float* r2 = img0.row(2);
        for (int i = 0; i < outh; i++)
        {
            int j = 0;
            for (; j + 3 < outw; j += 4)
            {
                __m256 _r00 = _mm256_loadu_ps(r0);
                __m256 _r01 = _mm256_loadu_ps(r0 + 8);
                __m256 _r02 = _mm256_loadu_ps(r0 + 16);
                __m256 _r10 = _mm256_loadu_ps(r1);
                __m256 _r11 = _mm256_loadu_ps(r1 + 8);
                __m256 _r12 = _mm256_loadu_ps(r1 + 16);
                __m256 _r20 = _mm256_loadu_ps(r2);
                __m256 _r21 = _mm256_loadu_ps(r2 + 8);
                __m256 _r22 = _mm256_loadu_ps(r2 + 16);

                __m256 _max00 = _mm256_max_ps(_r00, _r01);
                _max00 = _mm256_max_ps(_max00, _r02);
                _max00 = _mm256_max_ps(_max00, _r10);
                _max00 = _mm256_max_ps(_max00, _r11);
                __m256 _max01 = _mm256_max_ps(_r12, _r20);
                _max01 = _mm256_max_ps(_max01, _r21);
                _max01 = _mm256_max_ps(_max01, _r22);

                __m256 _r03 = _mm256_loadu_ps(r0 + 24);
                __m256 _r04 = _mm256_loadu_ps(r0 + 32);
                __m256 _r13 = _mm256_loadu_ps(r1 + 24);
                __m256 _r14 = _mm256_loadu_ps(r1 + 32);
                __m256 _r23 = _mm256_loadu_ps(r2 + 24);
                __m256 _r24 = _mm256_loadu_ps(r2 + 32);

                _mm256_storeu_ps(outptr, _mm256_max_ps(_max00, _max01));

                __m256 _max10 = _mm256_max_ps(_r03, _r04);
                _max10 = _mm256_max_ps(_max10, _r02);
                _max10 = _mm256_max_ps(_max10, _r13);
                _max10 = _mm256_max_ps(_max10, _r14);
                __m256 _max11 = _mm256_max_ps(_r12, _r23);
                _max10 = _mm256_max_ps(_max10, _r24);
                _max10 = _mm256_max_ps(_max10, _r22);

                __m256 _r05 = _mm256_loadu_ps(r0 + 40);
                __m256 _r06 = _mm256_loadu_ps(r0 + 48);
                __m256 _r15 = _mm256_loadu_ps(r1 + 40);
                __m256 _r16 = _mm256_loadu_ps(r1 + 48);
                __m256 _r25 = _mm256_loadu_ps(r2 + 40);
                __m256 _r26 = _mm256_loadu_ps(r2 + 48);

                _mm256_storeu_ps(outptr + 8, _mm256_max_ps(_max10, _max11));

                __m256 _max20 = _mm256_max_ps(_r05, _r06);
                _max20 = _mm256_max_ps(_max20, _r04);
                _max20 = _mm256_max_ps(_max20, _r15);
                _max20 = _mm256_max_ps(_max20, _r16);
                __m256 _max21 = _mm256_max_ps(_r14, _r25);
                _max20 = _mm256_max_ps(_max20, _r26);
                _max20 = _mm256_max_ps(_max20, _r24);

                __m256 _r07 = _mm256_loadu_ps(r0 + 56);
                __m256 _r08 = _mm256_loadu_ps(r0 + 64);
                __m256 _r17 = _mm256_loadu_ps(r1 + 56);
                __m256 _r18 = _mm256_loadu_ps(r1 + 64);
                __m256 _r27 = _mm256_loadu_ps(r2 + 56);
                __m256 _r28 = _mm256_loadu_ps(r2 + 64);

                _mm256_storeu_ps(outptr + 16, _mm256_max_ps(_max20, _max21));

                __m256 _max30 = _mm256_max_ps(_r07, _r08);
                _max30 = _mm256_max_ps(_max30, _r06);
                _max30 = _mm256_max_ps(_max30, _r17);
                _max30 = _mm256_max_ps(_max30, _r18);
                __m256 _max31 = _mm256_max_ps(_r16, _r27);
                _max30 = _mm256_max_ps(_max30, _r28);
                _max30 = _mm256_max_ps(_max30, _r26);

                _mm256_storeu_ps(outptr + 24, _mm256_max_ps(_max30, _max31));

                r0 += 64;
                r1 += 64;
                r2 += 64;
                outptr += 32;
            }
            for (; j + 1 < outw; j += 2)
            {
                __m256 _r00 = _mm256_loadu_ps(r0);
                __m256 _r01 = _mm256_loadu_ps(r0 + 8);
                __m256 _r02 = _mm256_loadu_ps(r0 + 16);
                __m256 _r10 = _mm256_loadu_ps(r1);
                __m256 _r11 = _mm256_loadu_ps(r1 + 8);
                __m256 _r12 = _mm256_loadu_ps(r1 + 16);
                __m256 _r20 = _mm256_loadu_ps(r2);
                __m256 _r21 = _mm256_loadu_ps(r2 + 8);
                __m256 _r22 = _mm256_loadu_ps(r2 + 16);

                __m256 _max00 = _mm256_max_ps(_r00, _r01);
                _max00 = _mm256_max_ps(_max00, _r02);
                _max00 = _mm256_max_ps(_max00, _r10);
                _max00 = _mm256_max_ps(_max00, _r11);
                __m256 _max01 = _mm256_max_ps(_r12, _r20);
                _max01 = _mm256_max_ps(_max01, _r21);
                _max01 = _mm256_max_ps(_max01, _r22);

                __m256 _r03 = _mm256_loadu_ps(r0 + 24);
                __m256 _r04 = _mm256_loadu_ps(r0 + 32);
                __m256 _r13 = _mm256_loadu_ps(r1 + 24);
                __m256 _r14 = _mm256_loadu_ps(r1 + 32);
                __m256 _r23 = _mm256_loadu_ps(r2 + 24);
                __m256 _r24 = _mm256_loadu_ps(r2 + 32);

                _mm256_storeu_ps(outptr, _mm256_max_ps(_max00, _max01));

                __m256 _max10 = _mm256_max_ps(_r03, _r04);
                _max10 = _mm256_max_ps(_max10, _r02);
                _max10 = _mm256_max_ps(_max10, _r13);
                _max10 = _mm256_max_ps(_max10, _r14);
                __m256 _max11 = _mm256_max_ps(_r12, _r23);
                _max10 = _mm256_max_ps(_max10, _r24);
                _max10 = _mm256_max_ps(_max10, _r22);

                _mm256_storeu_ps(outptr + 8, _mm256_max_ps(_max10, _max11));

                r0 += 32;
                r1 += 32;
                r2 += 32;
                outptr += 16;
            }

            for (; j < outw; j++)
            {
                __m256 _r00 = _mm256_loadu_ps(r0);
                __m256 _r01 = _mm256_loadu_ps(r0 + 8);
                __m256 _r02 = _mm256_loadu_ps(r0 + 16);
                __m256 _r10 = _mm256_loadu_ps(r1);
                __m256 _r11 = _mm256_loadu_ps(r1 + 8);
                __m256 _r12 = _mm256_loadu_ps(r1 + 16);
                __m256 _r20 = _mm256_loadu_ps(r2);
                __m256 _r21 = _mm256_loadu_ps(r2 + 8);
                __m256 _r22 = _mm256_loadu_ps(r2 + 16);

                __m256 _max0 = _mm256_max_ps(_r00, _r01);
                _max0 = _mm256_max_ps(_max0, _r02);
                _max0 = _mm256_max_ps(_max0, _r10);
                _max0 = _mm256_max_ps(_max0, _r11);
                __m256 _max1 = _mm256_max_ps(_r12, _r20);
                _max1 = _mm256_max_ps(_max1, _r21);
                _max1 = _mm256_max_ps(_max1, _r22);

                _mm256_storeu_ps(outptr, _mm256_max_ps(_max0, _max1));

                r0 += 16;
                r1 += 16;
                r2 += 16;
                outptr += 8;
            }

            r0 += tailstep;
            r1 += tailstep;
            r2 += tailstep;
        }
    }
}